

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_xsiexpdp(DisasContext_conflict10 *ctx)

{
  TCGv_i64 arg1;
  TCGContext_conflict10 *s;
  TCGv_i64 arg1_00;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 ret;
  
  if (ctx->vsx_enabled != false) {
    arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
    s = ctx->uc->tcg_ctx;
    arg1_00 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_andi_i64_ppc64(s,(TCGv_i64)((long)ts_00 - (long)s),arg1,-0x7ff0000000000001);
    tcg_gen_andi_i64_ppc64(s,ret,arg1_00,0x7ff);
    tcg_gen_shli_i64_ppc64(s,ret,ret,0x34);
    tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)ts_00,(TCGArg)ts_00,(TCGArg)ts);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28
                             ));
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xsiexpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv ra = cpu_gpr[rA(ctx->opcode)];
    TCGv rb = cpu_gpr[rB(ctx->opcode)];
    TCGv_i64 t0;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    xth = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_andi_i64(tcg_ctx, xth, ra, 0x800FFFFFFFFFFFFF);
    tcg_gen_andi_i64(tcg_ctx, t0, rb, 0x7FF);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 52);
    tcg_gen_or_i64(tcg_ctx, xth, xth, t0);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    /* dword[1] is undefined */
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, xth);
}